

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cProgramInterfaceQueryTests.cpp
# Opt level: O1

void __thiscall
glcts::anon_unknown_0::ComputeShaderTest::VerifyCompute
          (ComputeShaderTest *this,GLuint program,long *error)

{
  GLenum *pGVar1;
  GLint *pGVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  uint uVar4;
  mapped_type *pmVar5;
  undefined4 in_register_00000034;
  GLenum props4 [9];
  GLint expected4 [9];
  key_type local_f8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  indicesBV;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  indicesSSB;
  GLint expected3 [7];
  GLenum props3 [7];
  
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xd])
            (this,CONCAT44(in_register_00000034,program),0x92e5,0x92f6,0xf,error);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xd])
            (this,program,0x92e5,0x92f5,1,error);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xd])
            (this,program,0x92e6,0x92f5,1,error);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xd])
            (this,program,0x92e6,0x92f6,7,error);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xd])
            (this,program,0x92e6,0x92f7,1,error);
  indicesSSB._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &indicesSSB._M_t._M_impl.super__Rb_tree_header._M_header;
  indicesSSB._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  indicesSSB._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  indicesSSB._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  indicesBV._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &indicesBV._M_t._M_impl.super__Rb_tree_header._M_header;
  indicesBV._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  indicesBV._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  indicesBV._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pGVar1 = props4 + 4;
  props4._0_8_ = pGVar1;
  indicesBV._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       indicesBV._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  indicesSSB._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       indicesSSB._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::_M_construct<char_const*>((string *)props4,"Output","");
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xf])
            (this,program,0x92e6,&indicesSSB,props4,error);
  if ((GLenum *)props4._0_8_ != pGVar1) {
    operator_delete((void *)props4._0_8_,props4._16_8_ + 1);
  }
  props4._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props4,"Output.data","");
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xf])
            (this,program,0x92e5,&indicesBV,props4,error);
  if ((GLenum *)props4._0_8_ != pGVar1) {
    operator_delete((void *)props4._0_8_,props4._16_8_ + 1);
  }
  props4._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props4,"Output","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesSSB,(key_type *)props4);
  uVar4 = *pmVar5;
  pGVar2 = expected4 + 4;
  expected4._0_8_ = pGVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)expected4,"Output","");
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x10])
            (this,program,0x92e6,(ulong)uVar4,expected4,error);
  if ((GLint *)expected4._0_8_ != pGVar2) {
    operator_delete((void *)expected4._0_8_,expected4._16_8_ + 1);
  }
  if ((GLenum *)props4._0_8_ != pGVar1) {
    operator_delete((void *)props4._0_8_,props4._16_8_ + 1);
  }
  props4._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props4,"Outputa.data","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesBV,(key_type *)props4);
  uVar4 = *pmVar5;
  expected4._0_8_ = pGVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)expected4,"Output.data[0]","");
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x10])
            (this,program,0x92e5,(ulong)uVar4,expected4,error);
  if ((GLint *)expected4._0_8_ != pGVar2) {
    operator_delete((void *)expected4._0_8_,expected4._16_8_ + 1);
  }
  if ((GLenum *)props4._0_8_ != pGVar1) {
    operator_delete((void *)props4._0_8_,props4._16_8_ + 1);
  }
  props3[4] = 0x930a;
  props3[5] = 0x9306;
  props3[6] = 0x9305;
  props3[0] = 0x92f9;
  props3[1] = 0x9302;
  props3[2] = 0x9304;
  props3[3] = 0x930b;
  expected3[0] = 7;
  expected3[1] = 0;
  expected3[2] = 1;
  expected3[3] = 1;
  expected3[4] = 0;
  expected3[5] = 0;
  props4._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props4,"Outputa.data","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesBV,(key_type *)props4);
  expected3[6] = *pmVar5;
  if ((GLenum *)props4._0_8_ != pGVar1) {
    operator_delete((void *)props4._0_8_,props4._16_8_ + 1);
  }
  props4._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props4,"Output","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesSSB,(key_type *)props4);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x13])
            (this,program,0x92e6,(ulong)*pmVar5,7,props3,7,expected3,error);
  if ((GLenum *)props4._0_8_ != pGVar1) {
    operator_delete((void *)props4._0_8_,props4._16_8_ + 1);
  }
  props4[4] = 0x9300;
  props4[5] = 0x930b;
  props4[6] = 0x930a;
  props4[7] = 0x9306;
  props4[0] = 0x92f9;
  props4[1] = 0x92fa;
  props4[2] = 0x92fb;
  props4[3] = 0x92fd;
  props4[8] = 0x930c;
  expected4[0] = 0xf;
  expected4[1] = 0x8b52;
  expected4[2] = 0;
  paVar3 = &local_f8.field_2;
  local_f8._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"Output","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesSSB,&local_f8);
  expected4[3] = *pmVar5;
  expected4[4] = 0;
  expected4[5] = 1;
  expected4[6] = 0;
  expected4[7] = 0;
  expected4[8] = 1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar3) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  local_f8._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"Outputa.data","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesBV,&local_f8);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x13])
            (this,program,0x92e5,(ulong)*pmVar5,9,props4,9,expected4,error);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar3) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&indicesBV._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&indicesSSB._M_t);
  return;
}

Assistant:

virtual void inline VerifyCompute(GLuint program, long& error)
	{
		VerifyGetProgramInterfaceiv(program, GL_BUFFER_VARIABLE, GL_MAX_NAME_LENGTH, 15, error);
		VerifyGetProgramInterfaceiv(program, GL_BUFFER_VARIABLE, GL_ACTIVE_RESOURCES, 1, error);
		VerifyGetProgramInterfaceiv(program, GL_SHADER_STORAGE_BLOCK, GL_ACTIVE_RESOURCES, 1, error);
		VerifyGetProgramInterfaceiv(program, GL_SHADER_STORAGE_BLOCK, GL_MAX_NAME_LENGTH, 7, error);
		VerifyGetProgramInterfaceiv(program, GL_SHADER_STORAGE_BLOCK, GL_MAX_NUM_ACTIVE_VARIABLES, 1, error);

		std::map<std::string, GLuint> indicesSSB;
		std::map<std::string, GLuint> indicesBV;
		VerifyGetProgramResourceIndex(program, GL_SHADER_STORAGE_BLOCK, indicesSSB, "Output", error);
		VerifyGetProgramResourceIndex(program, GL_BUFFER_VARIABLE, indicesBV, "Output.data", error);

		VerifyGetProgramResourceName(program, GL_SHADER_STORAGE_BLOCK, indicesSSB["Output"], "Output", error);
		VerifyGetProgramResourceName(program, GL_BUFFER_VARIABLE, indicesBV["Outputa.data"], "Output.data[0]", error);

		GLenum props3[] = { GL_NAME_LENGTH,
							GL_BUFFER_BINDING,
							GL_NUM_ACTIVE_VARIABLES,
							GL_REFERENCED_BY_COMPUTE_SHADER,
							GL_REFERENCED_BY_FRAGMENT_SHADER,
							GL_REFERENCED_BY_VERTEX_SHADER,
							GL_ACTIVE_VARIABLES };
		GLint expected3[] = { 7, 0, 1, 1, 0, 0, static_cast<GLint>(indicesBV["Outputa.data"]) };
		VerifyGetProgramResourceiv(program, GL_SHADER_STORAGE_BLOCK, indicesSSB["Output"], 7, props3, 7, expected3,
								   error);

		GLenum props4[] = { GL_NAME_LENGTH,
							GL_TYPE,
							GL_ARRAY_SIZE,
							GL_BLOCK_INDEX,
							GL_IS_ROW_MAJOR,
							GL_REFERENCED_BY_COMPUTE_SHADER,
							GL_REFERENCED_BY_FRAGMENT_SHADER,
							GL_REFERENCED_BY_VERTEX_SHADER,
							GL_TOP_LEVEL_ARRAY_SIZE };
		GLint expected4[] = { 15, 35666, 0, static_cast<GLint>(indicesSSB["Output"]), 0, 1, 0, 0, 1 };
		VerifyGetProgramResourceiv(program, GL_BUFFER_VARIABLE, indicesBV["Outputa.data"], 9, props4, 9, expected4,
								   error);
	}